

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Gia_Man_t *
Gia_SweeperExtractUserLogic
          (Gia_Man_t *p,Vec_Int_t *vProbeIds,Vec_Ptr_t *vInNames,Vec_Ptr_t *vOutNames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vObjIds_00;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar8;
  bool bVar9;
  int local_54;
  int ProbeId;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vValues;
  Vec_Int_t *vObjIds;
  Vec_Ptr_t *vOutNames_local;
  Vec_Ptr_t *vInNames_local;
  Vec_Int_t *vProbeIds_local;
  Gia_Man_t *p_local;
  
  if (vInNames != (Vec_Ptr_t *)0x0) {
    iVar1 = Gia_ManPiNum(p);
    iVar2 = Vec_PtrSize(vInNames);
    if (iVar1 != iVar2) {
      __assert_fail("vInNames == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                    ,0x16c,
                    "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  if (vOutNames != (Vec_Ptr_t *)0x0) {
    iVar1 = Vec_IntSize(vProbeIds);
    iVar2 = Vec_PtrSize(vOutNames);
    if (iVar1 != iVar2) {
      __assert_fail("vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                    ,0x16d,
                    "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  Gia_ManIncrementTravId(p);
  vObjIds_00 = Vec_IntAlloc(1000);
  for (local_54 = 0; iVar1 = Vec_IntSize(vProbeIds), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vProbeIds,local_54);
    iVar1 = Gia_SweeperProbeLit(p,iVar1);
    _ProbeId = Gia_Lit2Obj(p,iVar1);
    pGVar7 = Gia_Regular(_ProbeId);
    Gia_ManExtract_rec(p,pGVar7,vObjIds_00);
  }
  iVar1 = Gia_ManPiNum(p);
  iVar2 = Vec_IntSize(vObjIds_00);
  iVar3 = Vec_IntSize(vProbeIds);
  p_00 = Gia_ManStart(iVar1 + iVar2 + iVar3 + 0x65);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0;
  local_54 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar9 = false;
    if (local_54 < iVar1) {
      _ProbeId = Gia_ManCi(p,local_54);
      bVar9 = _ProbeId != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ManAppendCi(p_00);
    _ProbeId->Value = uVar5;
    local_54 = local_54 + 1;
  }
  Gia_ManHashStart(p_00);
  iVar1 = Vec_IntSize(vObjIds_00);
  p_01 = Vec_IntAlloc(iVar1);
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjIds_00);
    bVar9 = false;
    if (local_54 < iVar1) {
      iVar1 = Vec_IntEntry(vObjIds_00,local_54);
      _ProbeId = Gia_ManObj(p,iVar1);
      bVar9 = _ProbeId != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    Vec_IntPush(p_01,_ProbeId->Value);
    iVar1 = Gia_ObjFanin0Copy(_ProbeId);
    iVar2 = Gia_ObjFanin1Copy(_ProbeId);
    uVar5 = Gia_ManHashAnd(p_00,iVar1,iVar2);
    _ProbeId->Value = uVar5;
    local_54 = local_54 + 1;
  }
  Gia_ManHashStop(p_00);
  for (local_54 = 0; iVar1 = Vec_IntSize(vProbeIds), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vProbeIds,local_54);
    iVar1 = Gia_SweeperProbeLit(p,iVar1);
    _ProbeId = Gia_Lit2Obj(p,iVar1);
    pGVar7 = Gia_Regular(_ProbeId);
    uVar5 = pGVar7->Value;
    uVar4 = Gia_IsComplement(_ProbeId);
    Gia_ManAppendCo(p_00,uVar5 ^ uVar4);
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar9 = false;
    if (local_54 < iVar1) {
      _ProbeId = Gia_ManCi(p,local_54);
      bVar9 = _ProbeId != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    _ProbeId->Value = 0;
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjIds_00);
    bVar9 = false;
    if (local_54 < iVar1) {
      iVar1 = Vec_IntEntry(vObjIds_00,local_54);
      _ProbeId = Gia_ManObj(p,iVar1);
      bVar9 = _ProbeId != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Vec_IntEntry(p_01,local_54);
    _ProbeId->Value = uVar5;
    local_54 = local_54 + 1;
  }
  Vec_IntFree(vObjIds_00);
  Vec_IntFree(p_01);
  iVar1 = Gia_ManHasDangling(p_00);
  pTemp = p_00;
  if (iVar1 != 0) {
    pTemp = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  if (vInNames != (Vec_Ptr_t *)0x0) {
    pVVar8 = Vec_PtrDupStr(vInNames);
    pTemp->vNamesIn = pVVar8;
  }
  if (vOutNames != (Vec_Ptr_t *)0x0) {
    pVVar8 = Vec_PtrDupStr(vOutNames);
    pTemp->vNamesOut = pVVar8;
  }
  return pTemp;
}

Assistant:

Gia_Man_t * Gia_SweeperExtractUserLogic( Gia_Man_t * p, Vec_Int_t * vProbeIds, Vec_Ptr_t * vInNames, Vec_Ptr_t * vOutNames )
{
    Vec_Int_t * vObjIds, * vValues;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, ProbeId;
    assert( vInNames  == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames) );
    assert( vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames) );
    // create new
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + Vec_IntSize(vProbeIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    vValues = Vec_IntAlloc( Vec_IntSize(vObjIds) );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
    {
        Vec_IntPush( vValues, pObj->Value );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManAppendCo( pNew, Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj) );
    }
    // return the values back
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Vec_IntEntry( vValues, i );
    Vec_IntFree( vObjIds );
    Vec_IntFree( vValues );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // copy names if present
    if ( vInNames )
        pNew->vNamesIn = Vec_PtrDupStr( vInNames );
    if ( vOutNames )
        pNew->vNamesOut = Vec_PtrDupStr( vOutNames );
    return pNew;
}